

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTask.h
# Opt level: O0

void __thiscall
HighsTask::
Callable<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/mip/HighsMipSolverData.cpp:390:21)>
::operator()(Callable<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsMipSolverData_cpp:390:21)>
             *this)

{
  anon_class_16_2_663289be_for_functor callFunctor;
  
  anon_class_16_2_663289be_for_functor::operator()((anon_class_16_2_663289be_for_functor *)this);
  return;
}

Assistant:

virtual void operator()() override {
      F callFunctor = std::move(functor);
      callFunctor();
    }